

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Trap::Mark(Trap *this,Store *store)

{
  bool bVar1;
  reference this_00;
  Frame *frame;
  iterator __end2;
  iterator __begin2;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *__range2;
  Store *store_local;
  Trap *this_local;
  
  __end2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::begin
                     (&this->trace_);
  frame = (Frame *)std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::end
                             (&this->trace_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::interp::Frame_*,_std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>_>
                                *)&frame);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::interp::Frame_*,_std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>_>
              ::operator*(&__end2);
    Frame::Mark(this_00,store);
    __gnu_cxx::
    __normal_iterator<wabt::interp::Frame_*,_std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Trap::Mark(Store& store) {
  for (auto&& frame : trace_) {
    frame.Mark(store);
  }
}